

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O1

void __thiscall minibag::Bag::appendHeaderToBuffer(Bag *this,Buffer *buf,M_string *fields)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint32_t header_len;
  shared_ptr<unsigned_char[]> header_buffer;
  uint local_2c;
  void *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  local_28 = (void *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  miniros::Header::write((map *)fields,(shared_ptr *)&local_28,&local_2c);
  uVar1 = Buffer::getSize(buf);
  uVar2 = Buffer::getSize(buf);
  Buffer::setSize(buf,uVar2 + local_2c + 4);
  puVar3 = Buffer::getData(buf);
  *(uint *)(puVar3 + uVar1) = local_2c;
  puVar3 = Buffer::getData(buf);
  memcpy(puVar3 + (uVar1 + 4),local_28,(ulong)local_2c);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return;
}

Assistant:

void Bag::appendHeaderToBuffer(Buffer& buf, M_string const& fields) {
    std::shared_ptr<uint8_t[]> header_buffer;
    uint32_t header_len;
    miniros::Header::write(fields, header_buffer, header_len);

    uint32_t offset = buf.getSize();

    buf.setSize(buf.getSize() + 4 + header_len);

    memcpy(buf.getData() + offset, &header_len, 4);
    offset += 4;
    memcpy(buf.getData() + offset, header_buffer.get(), header_len);
}